

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC epoxy_glTextureStorage3DMultisample_resolver(void)

{
  PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC p_Var1;
  
  p_Var1 = (PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC)
           gl_provider_resolver
                     ("glTextureStorage3DMultisample",
                      epoxy_glTextureStorage3DMultisample_resolver::providers,
                      epoxy_glTextureStorage3DMultisample_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC
epoxy_glTextureStorage3DMultisample_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        52872 /* "glTextureStorage3DMultisample" */,
        52872 /* "glTextureStorage3DMultisample" */,
    };
    return gl_provider_resolver(entrypoint_strings + 52872 /* "glTextureStorage3DMultisample" */,
                                providers, entrypoints);
}